

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cpp
# Opt level: O1

string * __thiscall CBlock::ToString_abi_cxx11_(string *__return_storage_ptr__,CBlock *this)

{
  pointer psVar1;
  ostream *poVar2;
  pointer psVar3;
  long in_FS_OFFSET;
  unsigned_long *in_stack_fffffffffffffd88;
  long local_268;
  string local_260;
  string local_240;
  uint256 local_220;
  string local_200;
  string local_1e0;
  stringstream s;
  ostream local_1b0 [112];
  ios_base local_140 [264];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  CBlockHeader::GetHash(&local_220,&this->super_CBlockHeader);
  base_blob<256u>::ToString_abi_cxx11_(&local_200,&local_220);
  base_blob<256u>::ToString_abi_cxx11_(&local_240,&(this->super_CBlockHeader).hashPrevBlock);
  base_blob<256u>::ToString_abi_cxx11_(&local_260,&(this->super_CBlockHeader).hashMerkleRoot);
  local_268 = (long)(this->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->vtx).
                    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  tinyformat::
  format<std::__cxx11::string,int,std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_int,unsigned_int,unsigned_long>
            (&local_1e0,
             (tinyformat *)
             "CBlock(hash=%s, ver=0x%08x, hashPrevBlock=%s, hashMerkleRoot=%s, nTime=%u, nBits=%08x, nNonce=%u, vtx=%u)\n"
             ,(char *)&local_200,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
             (int *)&local_240,&local_260,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->super_CBlockHeader).nTime,&(this->super_CBlockHeader).nBits,
             &(this->super_CBlockHeader).nNonce,(uint *)&local_268,in_stack_fffffffffffffd88);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1b0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  psVar3 = (this->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->vtx).
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_1b0,"  ",2);
      CTransaction::ToString_abi_cxx11_
                (&local_1e0,
                 (psVar3->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                );
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1b0,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  std::ios_base::~ios_base(local_140);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string CBlock::ToString() const
{
    std::stringstream s;
    s << strprintf("CBlock(hash=%s, ver=0x%08x, hashPrevBlock=%s, hashMerkleRoot=%s, nTime=%u, nBits=%08x, nNonce=%u, vtx=%u)\n",
        GetHash().ToString(),
        nVersion,
        hashPrevBlock.ToString(),
        hashMerkleRoot.ToString(),
        nTime, nBits, nNonce,
        vtx.size());
    for (const auto& tx : vtx) {
        s << "  " << tx->ToString() << "\n";
    }
    return s.str();
}